

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stream.hpp
# Opt level: O1

size_t __thiscall
io::basic_string_stream<char,_std::char_traits<char>_>::write_some<io::net::const_buffer>
          (basic_string_stream<char,_std::char_traits<char>_> *this,const_buffer *cb,error_code *ec)

{
  ulong uVar1;
  error_category *peVar2;
  size_t from;
  
  peVar2 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar2;
  if (cb->size_ == 0) {
    from = 0;
  }
  else {
    uVar1 = (this->
            super_memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>).
            pos_;
    if ((long)uVar1 < 0) {
      __assert_fail("from_start >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/include/io/stream_position.hpp"
                    ,0x1d,
                    "io::stream_position<long>::stream_position(offset_type) [OffsetType = long]");
    }
    std::__cxx11::string::replace((ulong)&this->str_,uVar1,(char *)0x0,(ulong)cb->data_);
    from = cb->size_;
    detail::memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>::seek
              (&this->
                super_memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
               ,from,current,ec);
  }
  return from;
}

Assistant:

std::size_t write_some(const ConstBufSeq& cb, std::error_code& ec)
    {
        static_assert(is_const_buffer_sequence_v<ConstBufSeq>,
                      "Argument passed to write_some() is not a ConstBufferSequence");

        ec.clear();

        if (io::buffer_size(cb) == 0) {
            return 0;
        }

        std::size_t total_bytes_written = 0;
        auto first = io::buffer_sequence_begin(cb);
        auto last = io::buffer_sequence_end(cb);

        while (first != last) {
            str_.insert(this->get_position().offset_from_start(),
                        reinterpret_cast<const char_type*>(first->data()),
                        first->size()/sizeof(char_type));
            total_bytes_written += first->size();
            this->seek(first->size(), seek_mode::current, ec);
            ++first;
        }

        return total_bytes_written;
    }